

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNuGetGenerator.cxx
# Opt level: O2

int __thiscall cmCPackNuGetGenerator::PackageFiles(cmCPackNuGetGenerator *this)

{
  ComponentPackageMethod CVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *local_1b0 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Toplevel: ");
  poVar5 = std::operator<<(poVar5,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackNuGetGenerator.cxx"
                  ,0x19,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])(this);
  if ((char)iVar4 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NUGET_ORDINAL_MONOLITIC",
               (allocator<char> *)local_1b0);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"TRUE");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  else {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 == ONE_PACKAGE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NUGET_ALL_IN_ONE",(allocator<char> *)local_1b0);
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"TRUE");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    SetupGroupComponentVariables(this,CVar1 < ONE_PACKAGE_PER_GROUP);
  }
  bVar3 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackNuGet.cmake");
  if (bVar3) {
    AddGeneratedPackageNames(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Error while execution CPackNuGet.cmake");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackNuGetGenerator.cxx"
                    ,0x39,local_1b0[0]);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
  return (int)bVar3;
}

Assistant:

int cmCPackNuGetGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Toplevel: " << toplevel << std::endl);

  /* Reset package file name list it will be populated after the
   * `CPackNuGet.cmake` run */
  packageFileNames.clear();

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    if (componentPackageMethod == ONE_PACKAGE) {
      // CASE 1 : COMPONENT ALL-IN-ONE package
      // Meaning that all per-component pre-installed files
      // goes into the single package.
      this->SetOption("CPACK_NUGET_ALL_IN_ONE", "TRUE");
      SetupGroupComponentVariables(true);
    } else {
      // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
      // There will be 1 package for each component group
      // however one may require to ignore component group and
      // in this case you'll get 1 package for each component.
      SetupGroupComponentVariables(componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
    }
  } else {
    // CASE 3 : NON COMPONENT package.
    this->SetOption("CPACK_NUGET_ORDINAL_MONOLITIC", "TRUE");
  }

  auto retval = this->ReadListFile("Internal/CPack/CPackNuGet.cmake");
  if (retval) {
    AddGeneratedPackageNames();
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackNuGet.cmake" << std::endl);
  }

  return retval;
}